

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsyncResult.h
# Opt level: O0

int __thiscall nrg::AsyncResult<int>::Impl::getResult(Impl *this)

{
  bool bVar1;
  int *piVar2;
  undefined1 local_28 [8];
  unique_lock<std::mutex> lock;
  Impl *this_local;
  
  lock._8_8_ = this;
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_28,&this->guard_);
  bVar1 = std::experimental::fundamentals_v1::optional::operator_cast_to_bool
                    ((optional *)&this->result_);
  if (bVar1) {
    piVar2 = std::experimental::fundamentals_v1::optional<int>::operator*(&this->result_);
    this_local._4_4_ = *piVar2;
  }
  else {
    std::condition_variable::wait<nrg::AsyncResult<int>::Impl::getResult()const::_lambda()_1_>
              (&this->cond_,(unique_lock<std::mutex> *)local_28,(anon_class_8_1_8991fb9c)this);
    piVar2 = std::experimental::fundamentals_v1::optional<int>::operator*(&this->result_);
    this_local._4_4_ = *piVar2;
  }
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_28);
  return this_local._4_4_;
}

Assistant:

R getResult() const {
            std::unique_lock<std::mutex> lock(guard_);
            if (result_) {
                return *result_;
            }

            cond_.wait(lock, [this]() { return static_cast<bool>(result_); });
            return *result_;
        }